

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentProperty(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,string *lhs,string *rhs,CompatibleType t)

{
  __type _Var1;
  bool bVar2;
  bool bVar3;
  pair<bool,_const_char_*> pVar4;
  string null_ptr;
  allocator<char> local_71;
  string local_70;
  string local_50 [32];
  
  valueAsString<decltype(nullptr)>(&local_70,lhs);
  _Var1 = std::operator==(lhs,&local_70);
  if (_Var1) {
    _Var1 = std::operator==(rhs,&local_70);
    if (_Var1) {
      __return_storage_ptr__->first = true;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)lhs);
      goto LAB_002f3e87;
    }
  }
  _Var1 = std::operator==(lhs,&local_70);
  if (_Var1) {
    __return_storage_ptr__->first = true;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)rhs);
  }
  else {
    _Var1 = std::operator==(rhs,&local_70);
    if (_Var1) {
      __return_storage_ptr__->first = true;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)lhs);
    }
    else if (t - NumberMinType < 2) {
      pVar4 = consistentNumberProperty((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,t);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::string::string(local_50,(string *)&local_70);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>(local_50,pVar4.second,&local_71);
      }
      __return_storage_ptr__->first = pVar4.first;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,local_50);
      std::__cxx11::string::~string(local_50);
    }
    else if (t == StringType) {
      consistentStringProperty(__return_storage_ptr__,lhs,rhs);
    }
    else {
      if (t != BoolType) {
        __assert_fail("false && \"Unreachable!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                      ,0x11dc,
                      "std::pair<bool, std::string> consistentProperty(const std::string &, const std::string &, CompatibleType)"
                     );
      }
      bVar2 = cmSystemTools::IsOn(lhs);
      bVar3 = cmSystemTools::IsOn(rhs);
      if (bVar2 != bVar3) {
        lhs = &local_70;
      }
      __return_storage_ptr__->first = bVar2 == bVar3;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)lhs);
    }
  }
LAB_002f3e87:
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> consistentProperty(const std::string& lhs,
                                                const std::string& rhs,
                                                CompatibleType t)
{
  const std::string null_ptr = valueAsString(nullptr);

  if (lhs == null_ptr && rhs == null_ptr) {
    return std::make_pair(true, lhs);
  }
  if (lhs == null_ptr) {
    return std::make_pair(true, rhs);
  }
  if (rhs == null_ptr) {
    return std::make_pair(true, lhs);
  }

  switch (t) {
    case BoolType: {
      bool same = cmSystemTools::IsOn(lhs) == cmSystemTools::IsOn(rhs);
      return std::make_pair(same, same ? lhs : null_ptr);
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType: {
      auto value = consistentNumberProperty(lhs.c_str(), rhs.c_str(), t);
      return std::make_pair(
        value.first, value.first ? std::string(value.second) : null_ptr);
    }
  }
  assert(false && "Unreachable!");
  return std::pair<bool, std::string>(false, null_ptr);
}